

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::ArithMetaMethod(SQVM *this,SQInteger op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  uint uVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  bool bVar5;
  undefined1 local_50 [8];
  SQObjectPtr closure;
  SQMetaMethod mm;
  SQObjectPtr *dest_local;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  SQInteger op_local;
  SQVM *this_local;
  
  switch(op) {
  case 0x25:
    closure.super_SQObject._unVal.nInteger._4_4_ = 5;
    break;
  default:
    closure.super_SQObject._unVal.nInteger._4_4_ = 0;
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqvm.cpp"
                  ,0xa3,
                  "bool SQVM::ArithMetaMethod(SQInteger, const SQObjectPtr &, const SQObjectPtr &, SQObjectPtr &)"
                 );
  case 0x2a:
    closure.super_SQObject._unVal.nInteger._4_4_ = 2;
    break;
  case 0x2b:
    closure.super_SQObject._unVal.nInteger._4_4_ = 0;
    break;
  case 0x2d:
    closure.super_SQObject._unVal.nInteger._4_4_ = 1;
    break;
  case 0x2f:
    closure.super_SQObject._unVal.nInteger._4_4_ = 3;
  }
  if ((((o1->super_SQObject)._type & 0x2000000) != 0) &&
     ((((o1->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_50);
    pSVar1 = (o1->super_SQObject)._unVal.pTable;
    uVar2 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar1,this,(ulong)(uint)closure.super_SQObject._unVal.nInteger._4_4_,
                   (SQObjectPtr *)local_50);
    bVar5 = (uVar2 & 1) != 0;
    if (bVar5) {
      Push(this,o1);
      Push(this,o2);
      this_local._7_1_ =
           CallMetaMethod(this,(SQObjectPtr *)local_50,closure.super_SQObject._unVal.nInteger._4_4_,
                          2,dest);
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_50);
    if (bVar5) goto LAB_001c598a;
  }
  pSVar3 = GetTypeName(o1);
  pSVar4 = GetTypeName(o2);
  Raise_Error(this,"arith op %c on between \'%s\' and \'%s\'",op,pSVar3,pSVar4);
  this_local._7_1_ = 0;
LAB_001c598a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::ArithMetaMethod(SQInteger op,const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &dest)
{
    SQMetaMethod mm;
    switch(op){
        case _SC('+'): mm=MT_ADD; break;
        case _SC('-'): mm=MT_SUB; break;
        case _SC('/'): mm=MT_DIV; break;
        case _SC('*'): mm=MT_MUL; break;
        case _SC('%'): mm=MT_MODULO; break;
        default: mm = MT_ADD; assert(0); break; //shutup compiler
    }
    if(is_delegable(o1) && _delegable(o1)->_delegate) {

        SQObjectPtr closure;
        if(_delegable(o1)->GetMetaMethod(this, mm, closure)) {
            Push(o1);Push(o2);
            return CallMetaMethod(closure,mm,2,dest);
        }
    }
    Raise_Error(_SC("arith op %c on between '%s' and '%s'"),op,GetTypeName(o1),GetTypeName(o2));
    return false;
}